

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

int32_t bf_get_int32_le(bfile_t *bfile)

{
  uint8_t uVar1;
  uint8_t uVar2;
  uint8_t uVar3;
  int8_t iVar4;
  
  uVar1 = bf_get_uint8(bfile);
  uVar2 = bf_get_uint8(bfile);
  uVar3 = bf_get_uint8(bfile);
  iVar4 = bf_get_int8(bfile);
  return CONCAT13(iVar4,CONCAT12(uVar3,CONCAT11(uVar2,uVar1)));
}

Assistant:

int32_t
bf_get_int32_le(
    bfile_t * bfile )
{
    int32_t val;
    val = bf_get_uint8( bfile );
    val |= bf_get_uint8( bfile ) << 8;
    val |= bf_get_uint8( bfile ) << 16;
    val |= bf_get_int8( bfile ) << 24;
    return val;
}